

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

double __thiscall icu_63::CalendarAstronomer::eclipticObliquity(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  
  UVar1 = uprv_isNaN_63(this->eclipObliquity);
  if (UVar1 == '\0') {
    dVar2 = this->eclipObliquity;
  }
  else {
    UVar1 = uprv_isNaN_63(this->julianDay);
    if (UVar1 == '\0') {
      dVar2 = this->julianDay;
    }
    else {
      dVar2 = (this->fTime + 210866760000000.0) / 86400000.0;
      this->julianDay = dVar2;
    }
    dVar2 = (dVar2 + -2451545.0) / 36525.0;
    dVar2 = (dVar2 * 5.027777777777778e-07 * dVar2 * dVar2 +
            dVar2 * -1.6666666666666665e-07 * dVar2 + dVar2 * -0.013004166666666666 + 23.439292) *
            0.017453292519943295;
    this->eclipObliquity = dVar2;
  }
  return dVar2;
}

Assistant:

double CalendarAstronomer::eclipticObliquity() {
    if (isINVALID(eclipObliquity)) {
        const double epoch = 2451545.0;     // 2000 AD, January 1.5

        double T = (getJulianDay() - epoch) / 36525;

        eclipObliquity = 23.439292
            - 46.815/3600 * T
            - 0.0006/3600 * T*T
            + 0.00181/3600 * T*T*T;

        eclipObliquity *= DEG_RAD;
    }
    return eclipObliquity;
}